

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

int PAL_iswdigit(char16_t c)

{
  BOOL BVar1;
  int iVar2;
  UnicodeDataRec local_18;
  UnicodeDataRec dataRec;
  UINT nRetVal;
  char16_t c_local;
  
  dataRec.nUnicodeValue = L'\0';
  dataRec.C1_TYPE_FLAGS = 0;
  dataRec.rangeValue = c;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  BVar1 = GetUnicodeData((uint)(ushort)c,&local_18);
  if (BVar1 == 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
  }
  else {
    dataRec._1_3_ = 0;
    dataRec.nUnicodeValue._0_1_ = (local_18.C1_TYPE_FLAGS & 4) != 0;
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  iVar2._0_2_ = dataRec.nUnicodeValue;
  iVar2._2_2_ = dataRec.C1_TYPE_FLAGS;
  return iVar2;
}

Assistant:

int
__cdecl
PAL_iswdigit( char16_t c )
{
    UINT nRetVal = 0;
#if HAVE_COREFOUNDATION
    static CFCharacterSetRef sDigitSet;

    if (sDigitSet == NULL)
    {
        sDigitSet = CFCharacterSetGetPredefined(
                                        kCFCharacterSetDecimalDigit);
    }
    PERF_ENTRY(iswdigit);
    ENTRY("PAL_iswdigit (c=%d)\n", c);
    nRetVal = CFCharacterSetIsCharacterMember(sDigitSet, c);
#else   /* HAVE_COREFOUNDATION */
    UnicodeDataRec dataRec;

    PERF_ENTRY(iswdigit);
    ENTRY("PAL_iswdigit (c=%d)\n", c);

    if (GetUnicodeData(c, &dataRec))
    {
        if (dataRec.C1_TYPE_FLAGS & C1_DIGIT)
        {
            nRetVal = 1;
        }
        else
        {
            nRetVal = 0;
        }
    }
    else
    {
        TRACE( "No corresponding unicode record for character %d.\n", c );
    }
#endif  /* HAVE_COREFOUNDATION */
    LOGEXIT("PAL_iswdigit returning %d\n", nRetVal);
    PERF_EXIT(iswdigit);
    return nRetVal;
}